

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

VkResult __thiscall
Diligent::CommandQueueVkImpl::Present(CommandQueueVkImpl *this,VkPresentInfoKHR *PresentInfo)

{
  int iVar1;
  VkResult VVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_QueueMutex);
  if (iVar1 == 0) {
    VVar2 = (*vkQueuePresentKHR)(this->m_VkQueue,PresentInfo);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
    return VVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

VkResult CommandQueueVkImpl::Present(const VkPresentInfoKHR& PresentInfo)
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};
    return vkQueuePresentKHR(m_VkQueue, &PresentInfo);
}